

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserTester_2000_2999.cpp
# Opt level: O0

void __thiscall psy::C::ParserTester::case2218(ParserTester *this)

{
  initializer_list<psy::C::SyntaxKind> __l;
  Expectation *pEVar1;
  allocator<char> local_231;
  string local_230;
  allocator<psy::C::SyntaxKind> local_209;
  SyntaxKind local_208 [20];
  iterator local_1e0;
  size_type local_1d8;
  vector<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_> local_1d0;
  Expectation local_1b8;
  Expectation local_100;
  allocator<char> local_31;
  string local_30;
  ParserTester *local_10;
  ParserTester *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"{ x ( ( y ) ) ; }",&local_31);
  Expectation::Expectation(&local_1b8);
  local_208[8] = 0x46b;
  local_208[9] = CallExpression;
  local_208[10] = IdentifierName;
  local_208[0xb] = ParenthesizedExpression;
  local_208[0xc] = IdentifierName;
  local_208[0] = CompoundStatement;
  local_208[1] = AmbiguousCallOrVariableDeclaration;
  local_208[2] = DeclarationStatement;
  local_208[3] = VariableAndOrFunctionDeclaration;
  local_208[4] = 0x407;
  local_208[5] = ParenthesizedDeclarator;
  local_208[6] = ParenthesizedDeclarator;
  local_208[7] = IdentifierDeclarator;
  local_1e0 = local_208;
  local_1d8 = 0xd;
  std::allocator<psy::C::SyntaxKind>::allocator(&local_209);
  __l._M_len = local_1d8;
  __l._M_array = local_1e0;
  std::vector<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>::vector
            (&local_1d0,__l,&local_209);
  pEVar1 = Expectation::AST(&local_1b8,&local_1d0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_230,"{ x ( ( y ) ) ; x ( ( y ) ) ; }",&local_231);
  pEVar1 = Expectation::ambiguity(pEVar1,&local_230);
  Expectation::Expectation(&local_100,pEVar1);
  parseStatement(this,&local_30,&local_100);
  Expectation::~Expectation(&local_100);
  std::__cxx11::string::~string((string *)&local_230);
  std::allocator<char>::~allocator(&local_231);
  std::vector<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>::~vector(&local_1d0);
  std::allocator<psy::C::SyntaxKind>::~allocator(&local_209);
  Expectation::~Expectation(&local_1b8);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  return;
}

Assistant:

void ParserTester::case2218()
{
    parseStatement("{ x ( ( y ) ) ; }",
                   Expectation().AST( { SyntaxKind::CompoundStatement,
                                        SyntaxKind::AmbiguousCallOrVariableDeclaration,
                                        SyntaxKind::DeclarationStatement,
                                        SyntaxKind::VariableAndOrFunctionDeclaration,
                                        SyntaxKind::TypedefName,
                                        SyntaxKind::ParenthesizedDeclarator,
                                        SyntaxKind::ParenthesizedDeclarator,
                                        SyntaxKind::IdentifierDeclarator,
                                        SyntaxKind::ExpressionStatement,
                                        SyntaxKind::CallExpression,
                                        SyntaxKind::IdentifierName,
                                        SyntaxKind::ParenthesizedExpression,
                                        SyntaxKind::IdentifierName })
                   .ambiguity("{ x ( ( y ) ) ; x ( ( y ) ) ; }"));
}